

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  GLubyte *pGVar2;
  GLContext *info;
  nk_context *pnVar3;
  int iVar4;
  nk_glfw glfw;
  nk_glfw nStack_47a8;
  
  iVar1 = glfwInit();
  iVar4 = -1;
  if (iVar1 == 0) {
    return -1;
  }
  glfwWindowHint(0x20003,0);
  window = glfwCreateWindow(0x4b0,0x438,"Falling sand",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(window);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    glfwSwapInterval(1);
    if (iVar1 == 0) {
      printf("Failed to initialize glad!");
      return -1;
    }
    pGVar2 = (*glad_glGetString)(0x1f00);
    printf("Vendor: %s\n",pGVar2);
    pGVar2 = (*glad_glGetString)(0x1f01);
    printf("Renderer: %s\n",pGVar2);
    pGVar2 = (*glad_glGetString)(0x1f02);
    printf("Version: %s\n",pGVar2);
    iVar1 = glfwWindowShouldClose(window);
    if (iVar1 != 0) {
      main_cold_1();
      return -1;
    }
    iVar4 = 0;
    AudioManagerInit();
    InitBuffers();
    InitShaders();
    InitGame();
    glfwSetMouseButtonCallback(window,OnMouseButtonEvent);
    glfwSetKeyCallback(window,OnKeyEvent);
    info = (GLContext *)malloc(0x30);
    info->window = window;
    info->vertexArrayId = vertexArrayId;
    info->indexBufferId = indexBufferId;
    info->basicShaderId = basicShaderId;
    info->gamefield = gamefield;
    AudioManagerPlaySoundOnce(Ambient);
    memset(&nStack_47a8,0,0x4780);
    pnVar3 = nk_glfw3_init(&nStack_47a8,window,NK_GLFW3_DEFAULT);
    info->guiContext = pnVar3;
    info->glfw = &nStack_47a8;
    nk_font_atlas_init_default(&nStack_47a8.atlas);
    nk_font_atlas_begin(&nStack_47a8.atlas);
    nk_glfw3_font_stash_end(&nStack_47a8);
    glfwSetWindowUserPointer(window,info);
    while (iVar1 = glfwWindowShouldClose(window), iVar1 == 0) {
      OnUpdate(info);
    }
    nk_glfw3_shutdown(&nStack_47a8);
    free(info);
  }
  glfwTerminate();
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {
    if (!glfwInit())
        return -1;

    glfwWindowHint(GLFW_RESIZABLE, GL_FALSE);
    window = glfwCreateWindow(WIDTH, HEIGHT, "Falling sand", NULL, NULL);

    if (!window) {
        glfwTerminate();
        return -1;
    }

    glfwMakeContextCurrent(window);
    int status = gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    if (!status) {
        printf("Failed to initialize glad!");
        return -1;
    }

    printf("Vendor: %s\n", glGetString(GL_VENDOR));
    printf("Renderer: %s\n", glGetString(GL_RENDERER));
    printf("Version: %s\n", glGetString(GL_VERSION));

    if (glfwWindowShouldClose(window)) {
        fprintf(stderr, "Unexpected window close!\n");
        return -1;
    }

    // Initializes all buffers and debug functions
    InitSound();
    InitBuffers();
    InitShaders();
//    InitDebug();
    InitGame();
    InitEventHandlers();

    struct GLContext* updateInfo = malloc(sizeof(struct GLContext));
    updateInfo->window = window;
    updateInfo->vertexArrayId = vertexArrayId;
    updateInfo->indexBufferId = indexBufferId;
    updateInfo->basicShaderId = basicShaderId;
    updateInfo->gamefield = gamefield;

    AudioManagerPlaySoundOnce(Ambient);

    struct nk_context* ctx;
    struct nk_glfw glfw = {0};
    ctx = nk_glfw3_init(&glfw, window, NK_GLFW3_DEFAULT);
    updateInfo->guiContext = ctx;
    updateInfo->glfw = &glfw;

    {
        struct nk_font_atlas* atlas;
        nk_glfw3_font_stash_begin(&glfw, &atlas);
        nk_glfw3_font_stash_end(&glfw);
    }

    glfwSetWindowUserPointer(window, updateInfo);

    while (!glfwWindowShouldClose(window)) {
        OnUpdate(updateInfo);
    }

    nk_glfw3_shutdown(&glfw);
    free(updateInfo);
    glfwTerminate();
    return 0;
}